

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createAlloc(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  RWNode *this_00;
  const_use_iterator AI_00;
  Use *this_01;
  ret_type pSVar2;
  Value *pVVar3;
  ret_type pMVar4;
  ret_type len;
  uint64_t s;
  Value *in_RSI;
  Offset *in_RDI;
  uint64_t size;
  AllocaInst *AI;
  Instruction *I_1;
  MemIntrinsic *MI;
  StoreInst *S;
  User *use;
  const_use_iterator E;
  const_use_iterator I;
  RWNode *node;
  undefined4 in_stack_ffffffffffffff68;
  RWNodeType in_stack_ffffffffffffff6c;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffff70;
  uint64_t o;
  Offset in_stack_ffffffffffffff98;
  Offset in_stack_ffffffffffffffa0;
  User *in_stack_ffffffffffffffd0;
  
  this_00 = create(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  llvm::Value::use_begin((Value *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  AI_00 = llvm::Value::use_end
                    ((Value *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  do {
    bVar1 = llvm::Value::use_iterator_impl<const_llvm::Use>::operator!=
                      ((use_iterator_impl<const_llvm::Use> *)in_stack_ffffffffffffff70,
                       (use_iterator_impl<const_llvm::Use> *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (!bVar1) {
LAB_0018ce32:
      len = llvm::dyn_cast<llvm::AllocaInst,llvm::Instruction_const>
                      ((Instruction *)in_stack_ffffffffffffff70);
      if (len != (ret_type)0x0) {
        GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getDataLayout
                  ((GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *)0x18ce64
                  );
        s = llvmutils::getAllocatedSize
                      ((AllocaInst *)AI_00.U,(DataLayout *)in_stack_ffffffffffffffd0);
        SubgraphNode<dg::dda::RWNode>::setSize(&this_00->super_SubgraphNode<dg::dda::RWNode>,s);
        bVar1 = RWNode::hasAddressTaken(this_00);
        if (!bVar1) {
          Offset::Offset((Offset *)&stack0xffffffffffffffa0,0);
          o = Offset::UNKNOWN;
          if (s != 0) {
            o = s;
          }
          Offset::Offset((Offset *)&stack0xffffffffffffff98,o);
          RWNode::addOverwrites
                    ((RWNode *)in_stack_ffffffffffffffa0.offset,
                     (RWNode *)in_stack_ffffffffffffff98.offset,in_RDI,(Offset *)len);
        }
      }
      return this_00;
    }
    this_01 = llvm::Value::use_iterator_impl<const_llvm::Use>::operator->
                        ((use_iterator_impl<const_llvm::Use> *)0x18cd7c);
    in_stack_ffffffffffffffd0 = llvm::Use::getUser(this_01);
    pSVar2 = llvm::dyn_cast<llvm::StoreInst,llvm::User>((User *)in_stack_ffffffffffffff70);
    if (pSVar2 == (ret_type)0x0) {
      pMVar4 = llvm::dyn_cast<llvm::MemIntrinsic,llvm::User>((User *)in_stack_ffffffffffffff70);
      if (pMVar4 == (ret_type)0x0) {
        llvm::dyn_cast<llvm::Instruction,llvm::Instruction_const>
                  ((Instruction *)in_stack_ffffffffffffff70);
      }
      else {
        pVVar3 = getMemIntrinsicValueOp
                           ((MemIntrinsic *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (pVVar3 == in_RSI) {
          RWNode::setAddressTaken(this_00);
          goto LAB_0018ce32;
        }
      }
    }
    else {
      pVVar3 = llvm::StoreInst::getValueOperand((StoreInst *)0x18cdaa);
      if (pVVar3 == in_RSI) {
        RWNode::setAddressTaken(this_00);
        goto LAB_0018ce32;
      }
    }
    llvm::Value::use_iterator_impl<const_llvm::Use>::operator++
              ((use_iterator_impl<const_llvm::Use> *)in_stack_ffffffffffffff70);
  } while( true );
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createAlloc(const llvm::Instruction *Inst) {
    using namespace llvm;

    RWNode &node = create(RWNodeType::ALLOC);

    // check if the address of this alloca is taken
    for (auto I = Inst->use_begin(), E = Inst->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        auto *use = *I;
#else
        auto *use = I->getUser();
#endif
        if (auto *S = dyn_cast<StoreInst>(use)) {
            if (S->getValueOperand() == Inst) {
                node.setAddressTaken();
                break;
            }
        } else if (auto *MI = dyn_cast<MemIntrinsic>(use)) {
            if (getMemIntrinsicValueOp(MI) == Inst) {
                node.setAddressTaken();
                break;
            }
        } else if (const auto *I = dyn_cast<Instruction>(Inst)) {
            assert(!I->mayWriteToMemory() &&
                   "Unhandled memory-writing instruction");
            (void) I; // c++17 TODO: replace with [[maybe_unused]]
        }
    }

    if (const AllocaInst *AI = dyn_cast<AllocaInst>(Inst)) {
        auto size = llvmutils::getAllocatedSize(AI, getDataLayout());
        node.setSize(size);
        // this is a alloca that does not have the address taken,
        // therefore we must always access the last instance in loads
        // (even in recursive functions) and may terminate the search
        // for definitions of this alloca at this alloca
        if (!node.hasAddressTaken()) {
            node.addOverwrites(&node, 0, size > 0 ? size : Offset::UNKNOWN);
        }
    }
    return &node;
}